

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.cpp
# Opt level: O2

void body(LexState *ls,expdesc *e,int ismethod,int line)

{
  byte bVar1;
  FuncState *pFVar2;
  lua_State *L;
  GCObject *o;
  Proto *pPVar3;
  int iVar4;
  TString *name;
  Node *pNVar5;
  long lVar6;
  int nvars;
  BlockCnt bl;
  FuncState new_fs;
  
  pFVar2 = ls->fs;
  L = ls->L;
  o = (GCObject *)pFVar2->f;
  lVar6 = (long)(o->p).sizep;
  if ((o->p).sizep <= pFVar2->np) {
    pNVar5 = (Node *)luaM_growaux_(L,(o->h).node,&(o->p).sizep,8,0x3ffff,"functions");
    (o->h).node = pNVar5;
    iVar4 = (o->p).sizep;
    for (; lVar6 < iVar4; lVar6 = lVar6 + 1) {
      (&(((o->h).node)->i_val).value_)[lVar6].gc = (GCObject *)0x0;
    }
  }
  new_fs.f = luaF_newproto(L);
  pNVar5 = (o->h).node;
  iVar4 = pFVar2->np;
  pFVar2->np = iVar4 + 1;
  (&(pNVar5->i_val).value_)[iVar4].gc = (GCObject *)new_fs.f;
  if (((((GCheader *)new_fs.f)->marked & 3) != 0) && (((o->gch).marked & 4) != 0)) {
    luaC_barrier_(L,o,(GCObject *)new_fs.f);
  }
  (new_fs.f)->linedefined = line;
  open_func(ls,&new_fs,&bl);
  checknext(ls,0x28);
  if (ismethod != 0) {
    new_localvarliteral_(ls,"self",4);
    adjustlocalvars(ls,1);
  }
  pFVar2 = ls->fs;
  pPVar3 = pFVar2->f;
  pPVar3->is_vararg = '\0';
  iVar4 = (ls->t).token;
  nvars = 0;
  if (iVar4 != 0x29) {
    nvars = 0;
    while (iVar4 == 0x120) {
      name = str_checkname(ls);
      new_localvar(ls,name);
      if (pPVar3->is_vararg != '\0') {
LAB_001120d1:
        nvars = nvars + 1;
        goto LAB_001120ed;
      }
      iVar4 = testnext(ls,0x2c);
      if (iVar4 == 0) goto LAB_001120d1;
      nvars = nvars + 1;
      iVar4 = (ls->t).token;
    }
    if (iVar4 != 0x118) {
      luaX_syntaxerror(ls,"<name> or \'...\' expected");
    }
    luaX_next(ls);
    pPVar3->is_vararg = '\x01';
  }
LAB_001120ed:
  adjustlocalvars(ls,nvars);
  bVar1 = pFVar2->nactvar;
  pPVar3->numparams = bVar1;
  luaK_reserveregs(pFVar2,(uint)bVar1);
  checknext(ls,0x29);
  statlist(ls);
  (new_fs.f)->lastlinedefined = ls->linenumber;
  check_match(ls,0x106,0x109,line);
  pFVar2 = ls->fs->prev;
  iVar4 = luaK_codeABx(pFVar2,OP_CLOSURE,0,pFVar2->np - 1);
  e->t = -1;
  e->f = -1;
  e->k = VRELOCABLE;
  (e->u).info = iVar4;
  luaK_exp2nextreg(pFVar2,e);
  close_func(ls);
  return;
}

Assistant:

static void body (LexState *ls, expdesc *e, int ismethod, int line) {
  /* body ->  `(' parlist `)' block END */
  FuncState new_fs;
  BlockCnt bl;
  new_fs.f = addprototype(ls);
  new_fs.f->linedefined = line;
  open_func(ls, &new_fs, &bl);
  checknext(ls, '(');
  if (ismethod) {
    new_localvarliteral(ls, "self");  /* create 'self' parameter */
    adjustlocalvars(ls, 1);
  }
  parlist(ls);
  checknext(ls, ')');
  statlist(ls);
  new_fs.f->lastlinedefined = ls->linenumber;
  check_match(ls, TK_END, TK_FUNCTION, line);
  codeclosure(ls, e);
  close_func(ls);
}